

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_ELSE(TT_ExecContext exc)

{
  FT_Bool FVar1;
  int local_14;
  FT_Int nIfs;
  TT_ExecContext exc_local;
  
  local_14 = 1;
  do {
    FVar1 = SkipCode(exc);
    if (FVar1 == '\x01') {
      return;
    }
    if (exc->opcode == 'X') {
      local_14 = local_14 + 1;
    }
    else if (exc->opcode == 'Y') {
      local_14 = local_14 + -1;
    }
  } while (local_14 != 0);
  return;
}

Assistant:

static void
  Ins_ELSE( TT_ExecContext  exc )
  {
    FT_Int  nIfs;


    nIfs = 1;

    do
    {
      if ( SkipCode( exc ) == FAILURE )
        return;

      switch ( exc->opcode )
      {
      case 0x58:    /* IF */
        nIfs++;
        break;

      case 0x59:    /* EIF */
        nIfs--;
        break;
      }
    } while ( nIfs != 0 );
  }